

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O2

void __thiscall OpenMD::Utils::Accumulator<double>::add(Accumulator<double> *this,double *val)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  
  uVar1 = this->Count_ + 1;
  this->Count_ = uVar1;
  dVar3 = *val;
  this->Val_ = dVar3;
  this->Total_ = dVar3 + this->Total_;
  auVar2._8_4_ = (int)(uVar1 >> 0x20);
  auVar2._0_8_ = uVar1;
  auVar2._12_4_ = 0x45300000;
  dVar3 = (auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  this->Avg_ = (*val - this->Avg_) / dVar3 + this->Avg_;
  this->Avg2_ = (*val * *val - this->Avg2_) / dVar3 + this->Avg2_;
  dVar3 = *val;
  if (uVar1 < 2) {
    this->Max_ = dVar3;
  }
  else {
    if (dVar3 <= this->Max_) {
      dVar3 = this->Max_;
    }
    this->Max_ = dVar3;
    dVar3 = *val;
    if (this->Min_ <= *val) {
      dVar3 = this->Min_;
    }
  }
  this->Min_ = dVar3;
  return;
}

Assistant:

void add(const T& val) {
      Count_++;

      Val_ = val;
      Total_ += val;
      Avg_ += (val - Avg_) / static_cast<RealType>(Count_);
      Avg2_ += (val * val - Avg2_) / static_cast<RealType>(Count_);

      if (Count_ <= 1) {
        Max_ = val;
        Min_ = val;
      } else {
        Max_ = val > Max_ ? val : Max_;
        Min_ = val < Min_ ? val : Min_;
      }
    }